

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_strided_get(Integer g_a,Integer *lo,Integer *hi,Integer *skip,void *buf,Integer *ld)

{
  long *plVar1;
  short sVar2;
  long lVar3;
  Integer *__src;
  int iVar4;
  int iVar5;
  Integer IVar6;
  long lVar7;
  void *dst_ptr;
  uint uVar8;
  long ndim;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  Integer *lo_00;
  ulong uVar13;
  long lVar14;
  int proc;
  char *prem;
  Integer *blo;
  Integer *bhi;
  Integer plo [7];
  int stride_rem [14];
  int count [14];
  Integer ldrem [7];
  int stride_loc [14];
  Integer phi [7];
  _iterator_hdl it_hdl;
  int local_500;
  uint local_4fc;
  Integer *local_4f8;
  int local_4ec;
  char *local_4e8;
  Integer *local_4e0;
  Integer *local_4d8;
  void *local_4d0;
  ulong local_4c8;
  Integer *local_4c0;
  long local_4b8;
  Integer local_4b0;
  long local_4a8 [8];
  int local_468 [16];
  int local_428;
  int aiStack_424 [15];
  Integer local_3e8 [8];
  int local_3a8;
  int aiStack_3a4 [15];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_4ec = GA[g_a + 1000].elemsize;
  sVar2 = GA[g_a + 1000].ndim;
  uVar8 = (uint)sVar2;
  local_4f8 = hi;
  local_4d0 = buf;
  local_4c0 = lo;
  local_4b0 = g_a;
  pnga_nnodes();
  local_4b8 = (long)GA[g_a + 1000].p_handle;
  local_4c8 = (ulong)uVar8;
  local_4fc = uVar8;
  if (0 < sVar2) {
    uVar13 = 0;
    do {
      if (skip[uVar13] < 1) {
        pnga_error("nga_strided_get: Invalid value of skip along coordinate ",uVar13);
      }
      uVar13 = uVar13 + 1;
    } while (local_4c8 != uVar13);
  }
  lo_00 = local_4c0;
  gai_iterator_init(local_4b0,local_4c0,local_4f8,&local_330);
  iVar4 = gai_iterator_next(&local_330,&local_500,&local_4e0,&local_4d8,&local_4e8,local_3e8);
  uVar8 = local_4fc;
  if (iVar4 != 0) {
    local_4f8 = (Integer *)(long)local_4ec;
    ndim = (long)(int)local_4fc;
    local_4c8 = local_4c8 << 3;
    lVar14 = local_4b8;
    do {
      uVar13 = local_4c8;
      __src = local_4d8;
      if ((short)uVar8 < 1) {
        IVar6 = gai_correct_strided_patch(ndim,lo_00,skip,local_4a8,local_368);
        if (IVar6 != 0) {
          lVar10 = 0;
          goto LAB_001cbb55;
        }
      }
      else {
        memcpy(local_4a8,local_4e0,local_4c8);
        lVar14 = local_4b8;
        lo_00 = local_4c0;
        memcpy(local_368,__src,uVar13);
        IVar6 = gai_correct_strided_patch(ndim,lo_00,skip,local_4a8,local_368);
        if (IVar6 != 0) {
          lVar10 = 0;
          lVar7 = 0;
          lVar12 = 1;
          do {
            lVar9 = lVar12;
            if (lVar7 < ndim + -1) {
              lVar9 = local_3e8[lVar7] * lVar12;
            }
            lVar10 = lVar10 + (local_4a8[lVar7] - local_4e0[lVar7]) * lVar12;
            lVar7 = lVar7 + 1;
            lVar12 = lVar9;
          } while (ndim != lVar7);
LAB_001cbb55:
          local_4e8 = local_4e8 + lVar10 * (long)local_4f8;
          lVar10 = (local_4a8[0] - *lo_00) / *skip;
          if (1 < (short)local_4fc) {
            lVar12 = 0;
            do {
              lVar3 = lVar12 + 1;
              lVar7 = lVar12 + 1;
              lVar9 = lVar12 + 1;
              plVar1 = ld + lVar12;
              lVar12 = lVar12 + 1;
              lVar10 = lVar10 + ((local_4a8[lVar3] - lo_00[lVar7]) / skip[lVar9]) * *plVar1;
            } while (ndim + -1 != lVar12);
          }
          local_428 = 1;
          iVar4 = (int)local_4f8;
          if ((short)local_4fc < 1) {
            dst_ptr = (void *)(lVar10 * (long)local_4f8 + (long)local_4d0);
            lVar12 = 0;
            local_468[0] = iVar4;
            local_428 = iVar4;
            local_3a8 = iVar4;
          }
          else {
            lVar12 = 0;
            do {
              uVar13 = local_368[lVar12] - local_4a8[lVar12];
              if ((long)uVar13 < 0) goto LAB_001cbcca;
              if (1 < skip[lVar12]) {
                uVar13 = uVar13 / (ulong)skip[lVar12];
              }
              aiStack_424[lVar12] = (int)uVar13 + 1;
              lVar12 = lVar12 + 1;
            } while (ndim != lVar12);
            dst_ptr = (void *)(lVar10 * (long)local_4f8 + (long)local_4d0);
            local_428 = iVar4;
            local_3a8 = iVar4;
            local_468[0] = iVar4;
            if (0 < (short)uVar8) {
              lVar10 = 0;
              iVar4 = local_4ec;
              iVar5 = local_4ec;
              do {
                iVar11 = (int)skip[lVar10] * iVar4;
                iVar4 = iVar4 * (int)local_3e8[lVar10];
                local_468[lVar10] = iVar11;
                local_468[lVar10 + 1] = iVar4;
                iVar5 = iVar5 * (int)ld[lVar10];
                aiStack_3a4[lVar10] = iVar5;
                lVar10 = lVar10 + 1;
              } while (ndim != lVar10);
            }
          }
          if ((int)lVar14 != -1) {
            local_500 = PGRP_LIST[lVar14].inv_map_proc_list[local_500];
          }
          ARMCI_GetS(local_4e8,local_468,dst_ptr,&local_3a8,&local_428,(int)lVar12,local_500);
        }
      }
LAB_001cbcca:
      iVar4 = gai_iterator_next(&local_330,&local_500,&local_4e0,&local_4d8,&local_4e8,local_3e8);
    } while (iVar4 != 0);
  }
  gai_iterator_destroy(&local_330);
  return;
}

Assistant:

void pnga_strided_get(Integer g_a, Integer *lo, Integer *hi, Integer *skip,
                   void    *buf, Integer *ld)
{
  /* g_a:    Global Array handle
     lo[]:   Array of lower indices of patch of global array
     hi[]:   Array of upper indices of patch of global array
     skip[]: Array of skips for each dimension
     buf[]:  Local buffer that patch will be copied from
     ld[]:   ndim-1 physical dimensions of local buffer */
  Integer p, np=0, handle = GA_OFFSET + g_a;
  Integer idx, size, nstride, p_handle, nproc;
  int i, proc, ndim;
  Integer ldrem[MAXDIM];
  Integer idx_buf, *blo, *bhi;
  Integer plo[MAXDIM],phi[MAXDIM];
  char *pbuf, *prem;
  int count[2*MAXDIM], stride_rem[2*MAXDIM], stride_loc[2*MAXDIM];
  _iterator_hdl it_hdl;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  nproc = pnga_nnodes();
  p_handle = GA[handle].p_handle;

  /* check values of skips to make sure they are legitimate */
  for (i = 0; i<ndim; i++) {
    if (skip[i]<1) {
      pnga_error("nga_strided_get: Invalid value of skip along coordinate ",i);
    }
  }

  gai_iterator_init(g_a, lo, hi, &it_hdl);
  while (gai_iterator_next(&it_hdl, &proc, &blo, &bhi, &prem, ldrem)) {
      /* Correct ranges to account for skips in original patch. If no
         data is left in patch jump to next processor in loop. */
      for (i=0; i<ndim; i++) {
        plo[i] = blo[i];
        phi[i] = bhi[i];
      }
      if (!gai_correct_strided_patch((Integer)ndim, lo, skip, plo, phi))
        continue;
      /* May need to correct location of remote buffer */
      gai_FindOffset(ndim,blo,plo,ldrem,&idx_buf);
      prem += size*idx_buf;

      /* get pointer in local buffer to point indexed by plo given that
         the corner of the buffer corresponds to the point indexed by lo */
      gai_ComputePatchIndexWithSkip(ndim, lo, plo, skip, ld, &idx_buf);
      pbuf = size*idx_buf + (char*)buf;

      /* Compute number of elements in each stride region and compute the
         number of stride regions. Store the results in count and nstride */
      if (!gai_ComputeCountWithSkip(ndim, plo, phi, skip, count, &nstride))
        continue;

      /* Scale first element in count by element size. The ARMCI_PutS routine
         uses this convention to figure out memory sizes. */
      count[0] *= size;

      /* Calculate strides in memory for remote processor indexed by proc and
         local buffer */ 
      gai_SetStrideWithSkip(ndim, size, ld, ldrem, stride_rem, stride_loc,
          skip);

      /* BJP */
      if (p_handle != -1) {
        proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
      }
      ARMCI_GetS(prem, stride_rem, pbuf, stride_loc, count, nstride-1, proc);
  }
  gai_iterator_destroy(&it_hdl);
}